

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O2

void llvm::DWARFYAML::EmitDebugAranges(raw_ostream *OS,Data *DI)

{
  pointer pAVar1;
  pointer pAVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  bool IsLittleEndian;
  bool IsLittleEndian_00;
  pointer pAVar6;
  pointer pAVar7;
  undefined1 local_78 [8];
  ARange Range;
  
  pAVar1 = (DI->ARanges).
           super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pAVar6 = (DI->ARanges).
           super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>.
           _M_impl.super__Vector_impl_data._M_start;
  while (pAVar6 != pAVar1) {
    ARange::ARange((ARange *)local_78,pAVar6);
    uVar3 = raw_ostream::tell(OS);
    writeInitialLength((InitialLength *)local_78,OS,DI->IsLittleEndian);
    writeInteger<unsigned_short>((unsigned_short)Range.Length.TotalLength64,OS,DI->IsLittleEndian);
    writeInteger<unsigned_int>(Range.Length.TotalLength64._4_4_,OS,DI->IsLittleEndian);
    writeInteger<unsigned_char>((byte)Range.Version,OS,IsLittleEndian);
    writeInteger<unsigned_char>(Range.Version._1_1_,OS,IsLittleEndian_00);
    uVar4 = raw_ostream::tell(OS);
    Range.Descriptors.
    super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pAVar6;
    uVar5 = alignTo(uVar4 - uVar3,(ulong)((uint)(byte)Range.Version * 2),0);
    ZeroFillBytes(OS,uVar5 - (uVar4 - uVar3));
    pAVar2 = Range.Descriptors.
             super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (pAVar7 = (pointer)Range._24_8_; pAVar7 != pAVar2; pAVar7 = pAVar7 + 1) {
      uVar3 = pAVar7->Length;
      writeVariableSizedInteger
                ((pAVar7->Address).value,(ulong)(byte)Range.Version,OS,DI->IsLittleEndian);
      writeVariableSizedInteger(uVar3,(ulong)(byte)Range.Version,OS,DI->IsLittleEndian);
    }
    ZeroFillBytes(OS,(ulong)((uint)(byte)Range.Version * 2));
    std::
    _Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
    ::~_Vector_base((_Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
                     *)&Range.AddrSize);
    pAVar6 = (pointer)&Range.Descriptors.
                       super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage[3].Length;
  }
  return;
}

Assistant:

void DWARFYAML::EmitDebugAranges(raw_ostream &OS, const DWARFYAML::Data &DI) {
  for (auto Range : DI.ARanges) {
    auto HeaderStart = OS.tell();
    writeInitialLength(Range.Length, OS, DI.IsLittleEndian);
    writeInteger((uint16_t)Range.Version, OS, DI.IsLittleEndian);
    writeInteger((uint32_t)Range.CuOffset, OS, DI.IsLittleEndian);
    writeInteger((uint8_t)Range.AddrSize, OS, DI.IsLittleEndian);
    writeInteger((uint8_t)Range.SegSize, OS, DI.IsLittleEndian);

    auto HeaderSize = OS.tell() - HeaderStart;
    auto FirstDescriptor = alignTo(HeaderSize, Range.AddrSize * 2);
    ZeroFillBytes(OS, FirstDescriptor - HeaderSize);

    for (auto Descriptor : Range.Descriptors) {
      writeVariableSizedInteger(Descriptor.Address, Range.AddrSize, OS,
                                DI.IsLittleEndian);
      writeVariableSizedInteger(Descriptor.Length, Range.AddrSize, OS,
                                DI.IsLittleEndian);
    }
    ZeroFillBytes(OS, Range.AddrSize * 2);
  }
}